

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

double __thiscall
ON_Xform::GetSurfaceNormalXformKeepLengthAndOrientation(ON_Xform *this,ON_Xform *N_xform)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ON_Xform *pOVar4;
  double *pdVar5;
  ON_Xform *pOVar6;
  byte bVar7;
  double __x;
  double x;
  ulong extraout_XMM0_Qb;
  double pivot;
  double local_1c8;
  ulong uStack_1c0;
  double local_1b8;
  ON_3dVector local_1b0;
  ON_Xform local_198;
  ON_Xform local_118;
  ON_Xform rotation;
  
  bVar7 = 0;
  pdVar5 = (double *)N_xform;
  for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pdVar5 = *(double *)this;
    this = (ON_Xform *)((long)this + 8);
    pdVar5 = pdVar5 + 1;
  }
  N_xform->m_xform[1][3] = 0.0;
  N_xform->m_xform[0][3] = 0.0;
  N_xform->m_xform[2][3] = 0.0;
  N_xform->m_xform[3][0] = 0.0;
  N_xform->m_xform[3][1] = 0.0;
  N_xform->m_xform[3][2] = 0.0;
  N_xform->m_xform[3][3] = 1.0;
  pivot = 0.0;
  __x = Determinant(N_xform,&pivot);
  local_1c8 = ABS(__x);
  uStack_1c0 = extraout_XMM0_Qb & 0x7fffffffffffffff;
  if (local_1c8 <= 3.308722450213671e-24) {
    return 0.0;
  }
  if (1.0 <= local_1c8 * 3.308722450213671e-24) {
    return 0.0;
  }
  if (local_1c8 * 2.220446049250313e-16 < ABS(pivot)) {
    pOVar4 = &Nan;
    pOVar6 = &rotation;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      pOVar6->m_xform[0][0] = pOVar4->m_xform[0][0];
      pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar7 * -2 + 1) * 8);
      pOVar6 = (ON_Xform *)((long)pOVar6 + ((ulong)bVar7 * -2 + 1) * 8);
    }
    iVar2 = DecomposeSimilarity(N_xform,&local_1b0,&local_1b8,&rotation,2.3283064365386963e-10);
    if (iVar2 == 0) {
      bVar1 = Invert(N_xform,(double *)0x0);
      if (!bVar1) {
        return 0.0;
      }
      N_xform->m_xform[1][3] = 0.0;
      N_xform->m_xform[0][3] = 0.0;
      N_xform->m_xform[3][1] = 0.0;
      N_xform->m_xform[3][2] = 0.0;
      N_xform->m_xform[2][3] = 0.0;
      N_xform->m_xform[3][0] = 0.0;
      N_xform->m_xform[3][3] = 1.0;
      Transpose(N_xform);
      if (ABS(local_1c8 + -1.0) <= 1.490116119385e-08) {
        return __x;
      }
      x = pow(__x,-0.3333333333333333);
    }
    else {
      pOVar4 = &rotation;
      pOVar6 = N_xform;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        pOVar6->m_xform[0][0] = pOVar4->m_xform[0][0];
        pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar7 * -2 + 1) * 8);
        pOVar6 = (ON_Xform *)((long)pOVar6 + ((ulong)bVar7 * -2 + 1) * 8);
      }
      if (0.0 <= __x) {
        return __x;
      }
      x = -1.0;
    }
    ON_Xform(&local_198,x);
    operator*(&local_118,&local_198,N_xform);
    pOVar4 = &local_118;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      N_xform->m_xform[0][0] = pOVar4->m_xform[0][0];
      pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar7 * -2 + 1) * 8);
      N_xform = (ON_Xform *)((long)N_xform + ((ulong)bVar7 * -2 + 1) * 8);
    }
    return __x;
  }
  return 0.0;
}

Assistant:

double ON_Xform::GetSurfaceNormalXformKeepLengthAndOrientation(ON_Xform& N_xform) const
{
  N_xform = *this;
  N_xform.Linearize();
  double pivot = 0;
  double det = N_xform.Determinant(&pivot);

  double tol = ON_SQRT_EPSILON * ON_SQRT_EPSILON * ON_SQRT_EPSILON;
  if (fabs(det) <= tol || fabs(det) * tol >= 1.0 || fabs(pivot) <= ON_EPSILON * fabs(det))
    return 0.;

  ON_3dVector translation{ ON_3dVector::NanVector };
  double scale{ ON_DBL_QNAN };
  ON_Xform rotation{ ON_Xform::Nan };
  const int is_similarity = N_xform.DecomposeSimilarity(translation, scale, rotation, ON_ZERO_TOLERANCE);
  // If it's a uniform scale, handle it, otherwise need to get the inverse.
  if (is_similarity != 0)
  {
    N_xform = rotation;
    if (det < 0)
    {
      N_xform = ON_Xform(-1.) * N_xform;
    }
    return det;
  }

  if (!N_xform.Invert()) return 0.;
  N_xform.Linearize();
  N_xform.Transpose();
  if (abs(abs(det) - 1) > ON_SQRT_EPSILON)
  {
    N_xform = ON_Xform(pow(det, -1. / 3.)) * N_xform;
  }

  return det;
}